

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void array_suite::fail_missing_begin(void)

{
  char input [2];
  reader reader;
  undefined4 local_170;
  char local_16a [2];
  view_type local_168;
  basic_reader<char> local_158;
  
  local_16a[0] = ']';
  local_16a[1] = '\0';
  local_168._M_len = strlen(local_16a);
  local_168._M_str = local_16a;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_168);
  local_168._M_len = CONCAT44(local_168._M_len._4_4_,local_158.decoder.current.code);
  local_170 = 0xfffffffb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unbalanced_end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x213,"void array_suite::fail_missing_begin()",&local_168,&local_170);
  local_168._M_len = trial::protocol::json::basic_reader<char>::level(&local_158);
  local_170 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x214,"void array_suite::fail_missing_begin()",&local_168,&local_170);
  local_168._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_168._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x215,"void array_suite::fail_missing_begin()",&local_168,"]");
  local_168._M_len = (long)local_158.decoder.input.tail - (long)local_158.decoder.input.head;
  local_168._M_str = local_158.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[1]>
            ("reader.tail()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x216,"void array_suite::fail_missing_begin()",&local_168,"");
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void fail_missing_begin()
{
    const char input[] = "]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unbalanced_end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "");
}